

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islist.h
# Opt level: O0

void __thiscall
soplex::IsList<soplex::SVSetBase<double>::DLPSV>::move
          (IsList<soplex::SVSetBase<double>::DLPSV> *this,ptrdiff_t delta)

{
  DLPSV *pDVar1;
  DLPSV **ppDVar2;
  long in_RSI;
  IsList<soplex::SVSetBase<double>::DLPSV> *in_RDI;
  DLPSV *elem;
  DLPSV *in_stack_ffffffffffffffc8;
  DLPSV *in_stack_ffffffffffffffd0;
  DLPSV *local_18;
  
  if (in_RDI->the_first != (DLPSV *)0x0) {
    in_RDI->the_last =
         (DLPSV *)((long)&(in_RDI->the_last->super_SVectorBase<double>).m_elem + in_RSI);
    in_RDI->the_first =
         (DLPSV *)((long)&(in_RDI->the_first->super_SVectorBase<double>).m_elem + in_RSI);
    local_18 = first(in_RDI);
    while (local_18 != (DLPSV *)0x0) {
      pDVar1 = last(in_RDI);
      if (local_18 != pDVar1) {
        ppDVar2 = SVSetBase<double>::DLPSV::next(local_18);
        in_stack_ffffffffffffffd0 =
             (DLPSV *)((long)&((*ppDVar2)->super_SVectorBase<double>).m_elem + in_RSI);
        ppDVar2 = SVSetBase<double>::DLPSV::next(local_18);
        *ppDVar2 = in_stack_ffffffffffffffd0;
      }
      local_18 = next((IsList<soplex::SVSetBase<double>::DLPSV> *)in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

void move(ptrdiff_t delta)
   {
      if(the_first)
      {
         T* elem;
         the_last  = reinterpret_cast<T*>(reinterpret_cast<char*>(the_last) + delta);
         the_first = reinterpret_cast<T*>(reinterpret_cast<char*>(the_first) + delta);

         for(elem = first(); elem; elem = next(elem))
            if(elem != last())
               elem->next() = reinterpret_cast<T*>(reinterpret_cast<char*>(elem->next()) + delta);
      }
   }